

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_tempo.c
# Opt level: O0

void maybe_add_to_tempo_map(smf_event_t *event)

{
  byte bVar1;
  int iVar2;
  double dVar3;
  int notes_per_note;
  int clocks_per_click;
  int denominator;
  int numerator;
  int new_tempo;
  smf_event_t *event_local;
  
  iVar2 = smf_event_is_metadata(event);
  if (iVar2 != 0) {
    if (event->track == (smf_track_t *)0x0) {
      __assert_fail("event->track != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x82,"void maybe_add_to_tempo_map(smf_event_t *)");
    }
    if (event->track->smf == (smf_t *)0x0) {
      __assert_fail("event->track->smf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x83,"void maybe_add_to_tempo_map(smf_event_t *)");
    }
    if (event->midi_buffer_length < 1) {
      __assert_fail("event->midi_buffer_length >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x84,"void maybe_add_to_tempo_map(smf_event_t *)");
    }
    if (event->midi_buffer[1] == 'Q') {
      iVar2 = (uint)event->midi_buffer[3] * 0x10000 + (uint)event->midi_buffer[4] * 0x100 +
              (uint)event->midi_buffer[5];
      if (iVar2 == 0) {
        g_log("libsmf",8,"Ignoring invalid tempo change.");
        return;
      }
      add_tempo(event->track->smf,event->time_pulses,iVar2);
    }
    if (event->midi_buffer[1] == 'X') {
      if (event->midi_buffer_length < 7) {
        g_log("libsmf",8,"Time Signature event seems truncated.");
      }
      else {
        bVar1 = event->midi_buffer[3];
        dVar3 = pow(2.0,(double)event->midi_buffer[4]);
        add_time_signature(event->track->smf,event->time_pulses,(uint)bVar1,(int)dVar3,
                           (uint)event->midi_buffer[5],(uint)event->midi_buffer[6]);
      }
    }
  }
  return;
}

Assistant:

void
maybe_add_to_tempo_map(smf_event_t *event)
{
	if (!smf_event_is_metadata(event))
		return;

	assert(event->track != NULL);
	assert(event->track->smf != NULL);
	assert(event->midi_buffer_length >= 1);

	/* Tempo Change? */
	if (event->midi_buffer[1] == 0x51) {
		int new_tempo = (event->midi_buffer[3] << 16) + (event->midi_buffer[4] << 8) + event->midi_buffer[5];
		if (new_tempo <= 0) {
			g_critical("Ignoring invalid tempo change.");
			return;
		}

		add_tempo(event->track->smf, event->time_pulses, new_tempo);
	}

	/* Time Signature? */
	if (event->midi_buffer[1] == 0x58) {
		int numerator, denominator, clocks_per_click, notes_per_note;

		if (event->midi_buffer_length < 7) {
			g_critical("Time Signature event seems truncated.");
			return;
		}

		numerator = event->midi_buffer[3];
		denominator = (int)pow(2, event->midi_buffer[4]);
		clocks_per_click = event->midi_buffer[5];
		notes_per_note = event->midi_buffer[6];

		add_time_signature(event->track->smf, event->time_pulses, numerator, denominator, clocks_per_click, notes_per_note);
	}

	return;
}